

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

void ContinuousReadTest(BasePort *port,uchar boardNum)

{
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  quadlet_t read_data;
  int local_54;
  long local_50;
  long local_48;
  uint local_3c;
  BasePort *local_38;
  
  uVar3 = 1;
  lVar7 = 0;
  local_3c = (uint)boardNum;
  uVar4 = 0;
  local_50 = 0;
  lVar6 = 0;
  local_48 = 0;
  bVar5 = false;
  local_38 = port;
  do {
    local_54 = 0;
    iVar1 = (*local_38->_vptr_BasePort[0x23])(local_38,(ulong)local_3c,4,&local_54);
    if ((char)iVar1 == '\0') {
      lVar6 = lVar6 + 1;
    }
    else if (local_54 == 0x514c4131) {
      local_48 = local_48 + 1;
    }
    else {
      local_50 = local_50 + 1;
    }
    if (5 < (ulong)(local_50 + lVar6)) {
      bVar5 = true;
    }
    if (9999 < uVar3) {
      bVar5 = true;
    }
    if ((uVar3 / 1000) * -1000 + 1 + uVar3 == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success = ",10);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", read failures = ",0x12);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", compare failures = ",0x15);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    lVar7 = lVar7 + -1;
    uVar3 = uVar3 + 1;
    uVar4 = uVar4 + 1;
  } while (!bVar5);
  if (lVar7 + (uVar4 / 1000) * 1000 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success = ",10);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", read failures = ",0x12);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", compare failures = ",0x15);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  return;
}

Assistant:

void  ContinuousReadTest(BasePort *port, unsigned char boardNum)
{
    bool done = false;
    quadlet_t read_data;
    //char buf[5] = "QLA1";
    char buf[5] = "1ALQ";
    size_t success = 0;
    size_t readFailures = 0;
    size_t compareFailures = 0;
    unsigned long count = 0;
    while (!done) {
        count++;
        read_data = 0;
        if (!port->ReadQuadlet(boardNum, 4, read_data))
            readFailures++;
        else {
            if (memcmp((void *)&read_data, buf, 4) == 0)
                success++;
            else
                compareFailures++;
        }
        if (readFailures + compareFailures > 5) done = true;
        if (count >= 10000) done = true;

        // print status
        if (count % 1000 == 0) {
            std::cout << "Success = " << std::dec << success << ", read failures = " << readFailures << ", compare failures = "
                      << compareFailures << std::endl;
        }
    }
    if (count % 1000 != 0) {
        std::cout << "Success = " << std::dec << success << ", read failures = " << readFailures << ", compare failures = "
                  << compareFailures << std::endl;
    }
}